

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode multi_xfers_add(Curl_multi *multi,Curl_easy *data)

{
  uint_tbl *tbl;
  curl_trc_feat *pcVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  CURLcode CVar5;
  uint uVar6;
  
  tbl = &multi->xfers;
  uVar3 = Curl_uint_tbl_capacity(tbl);
  uVar4 = Curl_uint_tbl_count(tbl);
  uVar6 = 4;
  if (4 < uVar3 >> 2) {
    uVar6 = uVar3 >> 2;
  }
  if (uVar3 - uVar4 <= uVar6) {
    uVar6 = uVar3 + uVar6 + 0x3f >> 6;
    CVar5 = Curl_uint_bset_resize(&multi->process,uVar6);
    if (CVar5 != CURLE_OK) {
      return CURLM_OUT_OF_MEMORY;
    }
    CVar5 = Curl_uint_bset_resize(&multi->pending,uVar6);
    if (CVar5 != CURLE_OK) {
      return CURLM_OUT_OF_MEMORY;
    }
    CVar5 = Curl_uint_bset_resize(&multi->msgsent,uVar6);
    if (CVar5 != CURLE_OK) {
      return CURLM_OUT_OF_MEMORY;
    }
    CVar5 = Curl_uint_tbl_resize(tbl,uVar6);
    if (CVar5 != CURLE_OK) {
      return CURLM_OUT_OF_MEMORY;
    }
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)) &&
        (0 < Curl_trc_feat_multi.log_level)))) {
      Curl_trc_multi(data,"increased xfer table size to %u",(ulong)uVar6);
    }
  }
  _Var2 = Curl_uint_tbl_add(tbl,data,&data->mid);
  return (uint)!_Var2 + (uint)!_Var2 * 2;
}

Assistant:

static CURLMcode multi_xfers_add(struct Curl_multi *multi,
                                 struct Curl_easy *data)
{
  /* We want `multi->xfers` to have "sufficient" free rows, so that we do
   * have to reuse the `mid` from a just removed easy right away.
   * Since uint_tbl and uint_bset is quite memory efficient,
   * regard less than 25% free as insufficient.
   * (for low capacities, e.g. multi_easy, 4 or less). */
  unsigned int capacity = Curl_uint_tbl_capacity(&multi->xfers);
  unsigned int unused = capacity - Curl_uint_tbl_count(&multi->xfers);
  unsigned int min_unused = CURLMAX(capacity >> 2, 4);

  if(unused <= min_unused) {
     /* make it a 64 multiple, since our bitsets frow by that and
      * small (easy_multi) grows to at least 64 on first resize. */
    unsigned int newsize = ((capacity + min_unused) + 63) / 64;
    /* Grow the bitsets first. Should one fail, we do not need
     * to downsize the already resized ones. The sets continue
     * to work properly when larger than the table, but not
     * the other way around. */
    if(Curl_uint_bset_resize(&multi->process, newsize) ||
       Curl_uint_bset_resize(&multi->pending, newsize) ||
       Curl_uint_bset_resize(&multi->msgsent, newsize) ||
       Curl_uint_tbl_resize(&multi->xfers, newsize))
      return CURLM_OUT_OF_MEMORY;
    CURL_TRC_M(data, "increased xfer table size to %u", newsize);
  }
  /* Insert the easy into the table now that MUST have room for it */
  if(!Curl_uint_tbl_add(&multi->xfers, data, &data->mid)) {
    DEBUGASSERT(0);
    return CURLM_OUT_OF_MEMORY;
  }
  return CURLM_OK;
}